

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcTests.c
# Opt level: O3

void runCBCTests(void)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0;
  printf("test256cbcMultiBlockEncryptDecrypt()");
  threefishSetKey((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                  Threefish256,(uint64_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_key,
                  threefizer_tweak);
  memcpy(&test256cbcMultiBlockEncryptDecrypt_ref_msg,
         "Privacy is a human right that is necessary for constructive growth and innovation of society. I do not wish to live in a society in which the government can and does spy on the communication of all citizens at all times. Government surveillance is wrong..."
         ,0x101);
  memcpy(&test256cbcMultiBlockEncryptDecrypt_test_msg_1,
         "Privacy is a human right that is necessary for constructive growth and innovation of society. I do not wish to live in a society in which the government can and does spy on the communication of all citizens at all times. Government surveillance is wrong..."
         ,0x100);
  memcpy(&test256cbcMultiBlockEncryptDecrypt_test_msg_2,
         "Privacy is a human right that is necessary for constructive growth and innovation of society. I do not wish to live in a society in which the government can and does spy on the communication of all citizens at all times. Government surveillance is wrong..."
         ,0x100);
  do {
    if ((&test256cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test256cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x22,"void test256cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  encryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,8);
  memcpy(&test256cbcMultiBlockEncryptDecrypt_ref_ct,&test256cbcMultiBlockEncryptDecrypt_test_msg_1,
         0x100);
  decryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,8);
  lVar2 = 0;
  do {
    if ((&test256cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test256cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x27,"void test256cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  encryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_2,8);
  decryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_bad_iv,
                 (uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_2,8);
  uVar1 = 0;
  do {
    if (uVar1 < 0x20) {
      if ((&test256cbcMultiBlockEncryptDecrypt_test_msg_2)[uVar1] ==
          (&test256cbcMultiBlockEncryptDecrypt_ref_msg)[uVar1]) {
        __assert_fail("test_msg_2[i] != ref_msg[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                      ,0x2e,"void test256cbcMultiBlockEncryptDecrypt()");
      }
    }
    else if ((&test256cbcMultiBlockEncryptDecrypt_test_msg_2)[uVar1] !=
             (&test256cbcMultiBlockEncryptDecrypt_ref_msg)[uVar1]) {
      __assert_fail("test_msg_2[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x2f,"void test256cbcMultiBlockEncryptDecrypt()");
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x100);
  encryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,2);
  getChainInBuffer((uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,2,Skein256);
  encryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011d400,2)
  ;
  getChainInBuffer((uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,4,Skein256);
  encryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011d440,2)
  ;
  getChainInBuffer((uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,6,Skein256);
  encryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011d480,2)
  ;
  lVar2 = 0;
  do {
    if ((&test256cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test256cbcMultiBlockEncryptDecrypt_ref_ct)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_ct[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x3c,"void test256cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  getChainInBuffer((uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,2,Skein256);
  decryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,2);
  getChainInBuffer((uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_1,4,Skein256);
  decryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011d400,2)
  ;
  getChainInBuffer((uint64_t *)&test256cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,6,Skein256);
  decryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_1,(uint64_t *)&DAT_0011d440,2)
  ;
  decryptInPlace((ThreefishKey_t *)test256cbcMultiBlockEncryptDecrypt_threefish_256_ctx,
                 (uint64_t *)test256cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011d480,2)
  ;
  lVar2 = 0;
  do {
    if ((&test256cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test256cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x48,"void test256cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  puts(" passed");
  lVar2 = 0;
  printf("test512cbcMultiBlockEncryptDecrypt()");
  threefishSetKey((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                  Threefish512,(uint64_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_key,
                  threefizer_tweak);
  memcpy(&test512cbcMultiBlockEncryptDecrypt_ref_msg,
         "Until such time that we are governed by a system where all laws are just, and there is no poverty, opression, or undue discrimination between all groups of the governed. Then there is a place for privacy and there is a place for civil disobedience. In order for this privacy to be observed it has to be respected as a civil liberty. The current system in place by the powers to be does not do that. They have chosen a system of all out surveillance that gathers all data available with little to no oversight ..."
         ,0x201);
  memcpy(&test512cbcMultiBlockEncryptDecrypt_test_msg_1,
         "Until such time that we are governed by a system where all laws are just, and there is no poverty, opression, or undue discrimination between all groups of the governed. Then there is a place for privacy and there is a place for civil disobedience. In order for this privacy to be observed it has to be respected as a civil liberty. The current system in place by the powers to be does not do that. They have chosen a system of all out surveillance that gathers all data available with little to no oversight ..."
         ,0x200);
  memcpy(&test512cbcMultiBlockEncryptDecrypt_test_msg_2,
         "Until such time that we are governed by a system where all laws are just, and there is no poverty, opression, or undue discrimination between all groups of the governed. Then there is a place for privacy and there is a place for civil disobedience. In order for this privacy to be observed it has to be respected as a civil liberty. The current system in place by the powers to be does not do that. They have chosen a system of all out surveillance that gathers all data available with little to no oversight ..."
         ,0x200);
  do {
    if ((&test512cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test512cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x72,"void test512cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x200);
  encryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,8);
  memcpy(&test512cbcMultiBlockEncryptDecrypt_ref_ct,&test512cbcMultiBlockEncryptDecrypt_test_msg_1,
         0x200);
  decryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,8);
  lVar2 = 0;
  do {
    if ((&test512cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test512cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x78,"void test512cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x200);
  encryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_2,8);
  decryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_bad_iv,
                 (uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_2,8);
  uVar1 = 0;
  do {
    if (uVar1 < 0x40) {
      if ((&test512cbcMultiBlockEncryptDecrypt_test_msg_2)[uVar1] ==
          (&test512cbcMultiBlockEncryptDecrypt_ref_msg)[uVar1]) {
        __assert_fail("test_msg_2[i] != ref_msg[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                      ,0x7f,"void test512cbcMultiBlockEncryptDecrypt()");
      }
    }
    else if ((&test512cbcMultiBlockEncryptDecrypt_test_msg_2)[uVar1] !=
             (&test512cbcMultiBlockEncryptDecrypt_ref_msg)[uVar1]) {
      __assert_fail("test_msg_2[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x80,"void test512cbcMultiBlockEncryptDecrypt()");
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x200);
  encryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,2);
  getChainInBuffer((uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,2,Skein512);
  encryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011db30,2)
  ;
  getChainInBuffer((uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,4,Skein512);
  encryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011dbb0,2)
  ;
  getChainInBuffer((uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,6,Skein512);
  encryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011dc30,2)
  ;
  lVar2 = 0;
  do {
    if ((&test512cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test512cbcMultiBlockEncryptDecrypt_ref_ct)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_ct[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x93,"void test512cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x200);
  getChainInBuffer((uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,2,Skein512);
  decryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,2);
  getChainInBuffer((uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_1,4,Skein512);
  decryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011db30,2)
  ;
  getChainInBuffer((uint64_t *)&test512cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,6,Skein512);
  decryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_1,(uint64_t *)&DAT_0011dbb0,2)
  ;
  decryptInPlace((ThreefishKey_t *)test512cbcMultiBlockEncryptDecrypt_threefish_512_ctx,
                 (uint64_t *)test512cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011dc30,2)
  ;
  lVar2 = 0;
  do {
    if ((&test512cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test512cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0xa4,"void test512cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x200);
  puts(" passed");
  lVar2 = 0;
  printf("test1024cbcMultiBlockEncryptDecrypt()");
  threefishSetKey((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                  Threefish1024,(uint64_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_key,
                  threefizer_tweak);
  memcpy(&test1024cbcMultiBlockEncryptDecrypt_ref_msg,
         "Outside, even through the shut window pane, the world looked cold. Down in the street little eddies of wind were whirling dust and torn paper into spirals, and though the sun was shinning and the sky a harsh blue, there seemed to be no color in anything except the posters that were plastered everywhere. The black-mustachio\'d face gazed down from every commanding corner. There was one on the house front immediately opposite. BIG BROTHER IS WATCHING YOU, the caption said, while the dark eyes looked deep into Winston\'s own. Down at street level another poster, torn at one corner, flapped fitfully in the wind, alternately covering and uncovering the single word INGSOC. In the far distance a helicopter skimmed down between the roofs, overhead for an instant like a blue-bottle, and darted away again with a curving flight. It was the Police Patrol, snooping into people\'s windows. The patrols did not matter, however. Only the Thought Police mattered. Behind Winston\'s back the voice from the telescreen was still   ..."
         ,0x401);
  memcpy(&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,
         "Outside, even through the shut window pane, the world looked cold. Down in the street little eddies of wind were whirling dust and torn paper into spirals, and though the sun was shinning and the sky a harsh blue, there seemed to be no color in anything except the posters that were plastered everywhere. The black-mustachio\'d face gazed down from every commanding corner. There was one on the house front immediately opposite. BIG BROTHER IS WATCHING YOU, the caption said, while the dark eyes looked deep into Winston\'s own. Down at street level another poster, torn at one corner, flapped fitfully in the wind, alternately covering and uncovering the single word INGSOC. In the far distance a helicopter skimmed down between the roofs, overhead for an instant like a blue-bottle, and darted away again with a curving flight. It was the Police Patrol, snooping into people\'s windows. The patrols did not matter, however. Only the Thought Police mattered. Behind Winston\'s back the voice from the telescreen was still   ..."
         ,0x400);
  memcpy(&test1024cbcMultiBlockEncryptDecrypt_test_msg_2,
         "Outside, even through the shut window pane, the world looked cold. Down in the street little eddies of wind were whirling dust and torn paper into spirals, and though the sun was shinning and the sky a harsh blue, there seemed to be no color in anything except the posters that were plastered everywhere. The black-mustachio\'d face gazed down from every commanding corner. There was one on the house front immediately opposite. BIG BROTHER IS WATCHING YOU, the caption said, while the dark eyes looked deep into Winston\'s own. Down at street level another poster, torn at one corner, flapped fitfully in the wind, alternately covering and uncovering the single word INGSOC. In the far distance a helicopter skimmed down between the roofs, overhead for an instant like a blue-bottle, and darted away again with a curving flight. It was the Police Patrol, snooping into people\'s windows. The patrols did not matter, however. Only the Thought Police mattered. Behind Winston\'s back the voice from the telescreen was still   ..."
         ,0x400);
  do {
    if ((&test1024cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test1024cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0xd6,"void test1024cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x400);
  encryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,8);
  memcpy(&test1024cbcMultiBlockEncryptDecrypt_ref_ct,&test1024cbcMultiBlockEncryptDecrypt_test_msg_1
         ,0x400);
  decryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,8);
  lVar2 = 0;
  do {
    if ((&test1024cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test1024cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0xdd,"void test1024cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x400);
  encryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_2,8);
  decryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_bad_iv,
                 (uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_2,8);
  uVar1 = 0;
  do {
    if (uVar1 < 0x80) {
      if ((&test1024cbcMultiBlockEncryptDecrypt_test_msg_2)[uVar1] ==
          (&test1024cbcMultiBlockEncryptDecrypt_ref_msg)[uVar1]) {
        __assert_fail("test_msg_2[i] != ref_msg[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                      ,0xe5,"void test1024cbcMultiBlockEncryptDecrypt()");
      }
    }
    else if ((&test1024cbcMultiBlockEncryptDecrypt_test_msg_2)[uVar1] !=
             (&test1024cbcMultiBlockEncryptDecrypt_ref_msg)[uVar1]) {
      __assert_fail("test_msg_2[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0xe6,"void test1024cbcMultiBlockEncryptDecrypt()");
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x400);
  encryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,2);
  getChainInBuffer((uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,2,Skein1024);
  encryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011e8e0,2
                );
  getChainInBuffer((uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,4,Skein1024);
  encryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011e9e0,2
                );
  getChainInBuffer((uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,6,Skein1024);
  encryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011eae0,2
                );
  lVar2 = 0;
  do {
    if ((&test1024cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test1024cbcMultiBlockEncryptDecrypt_ref_ct)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_ct[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0xf8,"void test1024cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x400);
  getChainInBuffer((uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,2,Skein1024);
  decryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_iv,
                 (uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,2);
  getChainInBuffer((uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_1,4,Skein1024);
  decryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011e8e0,2
                );
  getChainInBuffer((uint64_t *)&test1024cbcMultiBlockEncryptDecrypt_test_msg_1,
                   (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,6,Skein1024);
  decryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_1,(uint64_t *)&DAT_0011e9e0,2
                );
  decryptInPlace((ThreefishKey_t *)test1024cbcMultiBlockEncryptDecrypt_threefish_1024_ctx,
                 (uint64_t *)test1024cbcMultiBlockEncryptDecrypt_chain_0,(uint64_t *)&DAT_0011eae0,2
                );
  lVar2 = 0;
  do {
    if ((&test1024cbcMultiBlockEncryptDecrypt_test_msg_1)[lVar2] !=
        (&test1024cbcMultiBlockEncryptDecrypt_ref_msg)[lVar2]) {
      __assert_fail("test_msg_1[i] == ref_msg[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/cbcTests.c"
                    ,0x109,"void test1024cbcMultiBlockEncryptDecrypt()");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x400);
  puts(" passed");
  return;
}

Assistant:

static void test256cbcMultiBlockEncryptDecrypt()
{
    printf("test256cbcMultiBlockEncryptDecrypt()");
    const static uint8_t iv[] =
    { 
        1, 2 ,3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22,
        23, 24, 25, 26, 27, 28, 29, 30, 31, 32 
    };

    const static uint8_t bad_iv[] =
    {
        32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17, 16, 15, 14, 13,
        12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1
    };
    const static uint16_t state_size = Threefish256;
    const static uint64_t threefish_256_key[] =
    { 12345678, 910111213141516, 1718192021222324, 2526272829303132 }; 
    static ThreefishKey_t threefish_256_ctx;
    static uint8_t ref_msg[256] = { 0 }; //this is 8 blocks 
    static uint8_t ref_ct[256] = { 0 };
    static uint8_t test_msg_1[256] = { 0 }; 
    static uint8_t test_msg_2[256] = { 0 };
    static uint64_t chain_0[4] = { 0 };
    static uint64_t chain_1[4] = { 0 };
     
    threefishSetKey(&threefish_256_ctx, state_size, (uint64_t*)threefish_256_key, threefizer_tweak); //set up threefish
    strcpy((char*)ref_msg, "Privacy is a human right that is necessary for constructive growth and innovation of society. I do not wish to live in a society in which the government can and does spy on the communication of all citizens at all times. Government surveillance is wrong...");
    memcpy(test_msg_1, ref_msg, 256);
    memcpy(test_msg_2, ref_msg, 256);

    //a regular encrypt decrypt cycle
    for(int i=0; i<256; ++i) { assert(test_msg_1[i] == ref_msg[i]); } //test that test_msg and reg_msg are identical
    //cbc encrypt and decrypt the message and confirm we got what we started with
    encryptInPlace(&threefish_256_ctx, (uint64_t*)iv, (uint64_t*)test_msg_1, 8); 
    memcpy(ref_ct, test_msg_1, 256); //copy the cipher text to a reference text to compare with later chunked encrypt operations
    decryptInPlace(&threefish_256_ctx, (uint64_t*)iv, (uint64_t*)test_msg_1, 8);
    for(int i=0; i<256; ++i) { assert(test_msg_1[i] == ref_msg[i]); } //test that test_msg and reg_msg are identical
     
    encryptInPlace(&threefish_256_ctx, (uint64_t*)iv, (uint64_t*)test_msg_2, 8); 
    decryptInPlace(&threefish_256_ctx, (uint64_t*)bad_iv, (uint64_t*)test_msg_2, 8);
    //decrypting with the wrong iv causes the next subsequent block of text be corrupt but blocks after that should be unaffected
    for(int i=0; i<256; ++i) 
    { 
        if(i<32) { assert(test_msg_2[i] != ref_msg[i]); }
	    if(i>=32) { assert(test_msg_2[i] == ref_msg[i]); }
    }

    //do a 4 part encrypt to see if chain propagation works correctly
    //This simulates how chunks are broken up to due to threading and queue as you go system
    encryptInPlace(&threefish_256_ctx, (uint64_t*)iv, (uint64_t*)test_msg_1, 2); //encrypt the first 2 blocks with the iv
    getChainInBuffer((uint64_t*)test_msg_1, chain_0, 2, state_size); //get the last block of cipher text
    encryptInPlace(&threefish_256_ctx, chain_0, (uint64_t*)(test_msg_1 + 64), 2); 
    getChainInBuffer((uint64_t*)test_msg_1, chain_0, 4, state_size); //get the last block of cipher text
    encryptInPlace(&threefish_256_ctx, chain_0, (uint64_t*)(test_msg_1 + 128), 2); 
    getChainInBuffer((uint64_t*)test_msg_1, chain_0, 6, state_size); //get the last block of cipher text
    encryptInPlace(&threefish_256_ctx, chain_0, (uint64_t*)(test_msg_1 + 192), 2);
    //test that the cipher text from the multipart encrypt is the same as the ciphertext from the single part encrypt
    for(int i=0; i<256; ++i) { assert(test_msg_1[i] == ref_ct[i]); } 

    //do a 4 part decrypt to see if chain propigation works correctly
    //if it does we should arrive at the origninal plaintext
    getChainInBuffer((uint64_t*)test_msg_1, chain_0, 2, state_size); //get the last block of cipher text
    decryptInPlace(&threefish_256_ctx, (uint64_t*)iv, (uint64_t*)test_msg_1, 2); // decrypt the first 2 blocks using the iv
    getChainInBuffer((uint64_t*)test_msg_1, chain_1, 4, state_size); //get the last block of cipher text
    decryptInPlace(&threefish_256_ctx, (uint64_t*)chain_0, (uint64_t*)(test_msg_1 + 64), 2);
    getChainInBuffer((uint64_t*)test_msg_1, chain_0, 6, state_size); //get the last block of cipher text
    decryptInPlace(&threefish_256_ctx, (uint64_t*)chain_1, (uint64_t*)(test_msg_1 + 128), 2);
    decryptInPlace(&threefish_256_ctx, (uint64_t*)chain_0, (uint64_t*)(test_msg_1 + 192), 2);
    //test that the plain text from the multipart decrypt is the same that we started out with
    for(int i=0; i<256; ++i) { assert(test_msg_1[i] == ref_msg[i]); }

    printf(" passed\n");
}